

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

HighsHashTable<int,_int> * __thiscall
HighsHashTable<int,_int>::operator=
          (HighsHashTable<int,_int> *this,HighsHashTable<int,_int> *param_2)

{
  unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter> *in_RSI;
  HighsHashTable<int,_int> *in_RDI;
  
  std::unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>::operator=
            (in_RSI,&in_RDI->entries);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RSI,
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  in_RDI->tableSizeMask =
       (u64)in_RSI[2]._M_t.
            super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
            .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl;
  in_RDI->numHashShift =
       (u64)in_RSI[3]._M_t.
            super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
            .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl;
  in_RDI->numElements =
       (u64)in_RSI[4]._M_t.
            super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
            .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl;
  return in_RDI;
}

Assistant:

HighsHashTable<K, V>& operator=(HighsHashTable<K, V>&&) = default;